

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

void test_inst(float id,Am_Object *obj,Am_Object *names,int size)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  Am_Object *this;
  Am_Object *pAVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Am_Object *local_d8;
  Am_Object local_d0;
  Am_Object *local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  Am_Instance_Iterator iter;
  Am_Object local_90;
  Am_Object result_names [10];
  
  result_names[8].data = (Am_Object_Data *)0x0;
  result_names[9].data = (Am_Object_Data *)0x0;
  result_names[6].data = (Am_Object_Data *)0x0;
  result_names[7].data = (Am_Object_Data *)0x0;
  result_names[4].data = (Am_Object_Data *)0x0;
  result_names[5].data = (Am_Object_Data *)0x0;
  result_names[2].data = (Am_Object_Data *)0x0;
  result_names[3].data = (Am_Object_Data *)0x0;
  result_names[0].data = (Am_Object_Data *)0x0;
  result_names[1].data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_d0,obj);
  Am_Instance_Iterator::Am_Instance_Iterator(&iter,(Am_Object_Data *)&local_d0);
  Am_Object::~Am_Object(&local_d0);
  Am_Instance_Iterator::Start();
  pAVar4 = result_names;
  lVar7 = 0;
  while (cVar2 = Am_Instance_Iterator::Last(), cVar2 == '\0') {
    Am_Instance_Iterator::Get();
    Am_Object::operator=(pAVar4,&local_90);
    lVar7 = lVar7 + 1;
    Am_Object::~Am_Object(&local_90);
    pAVar4 = pAVar4 + 1;
    Am_Instance_Iterator::Next();
  }
  local_b0 = lVar7;
  if (size == (int)lVar7) {
    local_c0 = 1;
    local_c8 = result_names;
    local_b8 = 0;
    bVar1 = false;
    while (local_c8 = local_c8 + 1, local_b8 < size + -1) {
      this = result_names + local_b8;
      local_b8 = local_b8 + 1;
      pAVar4 = local_c8;
      for (uVar8 = local_c0; uVar8 < (uint)size; uVar8 = uVar8 + 1) {
        cVar2 = Am_Object::operator==(this,pAVar4);
        if (cVar2 != '\0') {
          bVar1 = true;
        }
        pAVar4 = pAVar4 + 1;
      }
      local_c0 = local_c0 + 1;
    }
    if (bVar1) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,id);
      pcVar5 = "       object returned more than once";
    }
    else {
      lVar7 = 0;
      uVar8 = 0;
      if (0 < size) {
        uVar8 = (ulong)(uint)size;
      }
      for (; local_b0 != lVar7; lVar7 = lVar7 + 1) {
        lVar6 = uVar8 + 1;
        pAVar4 = names;
        do {
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) goto LAB_00107cdb;
          cVar2 = Am_Object::operator==(pAVar4,result_names + lVar7);
          pAVar4 = pAVar4 + 1;
        } while (cVar2 == '\0');
        bVar1 = false;
      }
      if (!bVar1) {
        if (suppress_successful == 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"  result is expected");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        goto LAB_00107e19;
      }
LAB_00107cdb:
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,id);
      pcVar5 = "       returned objects do not match expected";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    printf("%f       number of objects do not match\n",SUB84((double)id,0));
  }
  uVar9 = 0;
  local_d8 = names;
  uVar8 = (ulong)(uint)size;
  if (size < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"expected object[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar9);
    poVar3 = std::operator<<(poVar3,"] = ");
    poVar3 = (ostream *)operator<<(poVar3,local_d8);
    std::operator<<(poVar3," ");
    local_d8 = local_d8 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pAVar4 = result_names;
  for (lVar7 = 0; local_b0 != lVar7; lVar7 = lVar7 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"result object[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar7);
    poVar3 = std::operator<<(poVar3,"] = ");
    poVar3 = (ostream *)operator<<(poVar3,pAVar4);
    std::operator<<(poVar3," ");
    pAVar4 = pAVar4 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"*** TEST DID NOT SUCCEED. ***");
  std::endl<char,std::char_traits<char>>(poVar3);
  failed_tests = failed_tests + 1;
LAB_00107e19:
  Am_Instance_Iterator::~Am_Instance_Iterator(&iter);
  lVar7 = 0x48;
  do {
    Am_Object::~Am_Object((Am_Object *)((long)&result_names[0].data + lVar7));
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
  return;
}

Assistant:

void
test_inst(float id, Am_Object obj, Am_Object names[], int size)
{
  Am_Object result_names[10];
  int num_results = 0;
  int i, j;

  Am_Instance_Iterator iter = obj;
  iter.Start();
  while (!iter.Last()) {
    result_names[num_results++] = iter.Get();
    iter.Next();
  }
  if (num_results == size) {
    bool fail = false;
    for (i = 0; i < num_results - 1; ++i)
      for (j = i + 1; j < num_results; ++j)
        if (result_names[i] == result_names[j])
          fail = true;
    if (!fail) {
      for (i = 0; i < num_results; ++i) {
        fail = true;
        for (j = 0; j < size; ++j)
          if (names[j] == result_names[i]) {
            fail = false;
            break;
          }
        if (fail)
          break;
      }
      if (!fail) {
        if (!suppress_successful)
          cout << "  result is expected" << endl;
        return;
      } else
        cout << id << "       returned objects do not match expected" << endl;
    } else
      cout << id << "       object returned more than once" << endl;
  } else
    printf("%f       number of objects do not match\n", id);
  for (i = 0; i < size; ++i)
    cout << "expected object[" << i << "] = " << names[i] << " ";
  cout << endl;
  for (i = 0; i < num_results; ++i)
    cout << "result object[" << i << "] = " << result_names[i] << " ";
  cout << endl;
  cout << "*** TEST DID NOT SUCCEED. ***" << endl;
  ++failed_tests;
}